

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinsizes.cpp
# Opt level: O1

void testwin1(void)

{
  Am_Drawonable *pAVar1;
  Am_Style local_20 [8];
  
  pAVar1 = root;
  Am_Style::Am_Style(local_20,(Am_Style *)&red);
  d1 = (Am_Drawonable *)
       (*(code *)**(undefined8 **)pAVar1)
                 (pAVar1,0x352,100,200,200,"D1","D1 Icon",1,0,local_20,0,1,1,0,0,1,1,0,1,0);
  Am_Style::~Am_Style(local_20);
  return;
}

Assistant:

void
testwin1()
{

  d1 = root->Create(TESTWINSIZES_D1_LEFT, 100, 200, 200, "D1", "D1 Icon", true,
                    false, red, false,
                    // Min/max width and height
                    1, 1, 0, 0, true,
                    // Query user for position
                    true, false);
  print_win_info(d1, "D1");
}